

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O2

void __thiscall S2Builder::CopyInputEdges(S2Builder *this)

{
  pointer pVVar1;
  pointer ppVar2;
  bool bVar3;
  InputEdge *e;
  pointer ppVar4;
  ulong uVar5;
  D *b;
  long lVar6;
  allocator_type local_69;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *local_68;
  vector<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_> sorted;
  vector<int,_std::allocator<int>_> vmap;
  
  SortInputVertices(&sorted,this);
  std::vector<int,_std::allocator<int>_>::vector
            (&vmap,((long)(this->input_vertices_).
                          super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->input_vertices_).
                         super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                         _M_impl.super__Vector_impl_data._M_start) / 0x18,&local_69);
  local_68 = &this->sites_;
  pVVar1 = (this->sites_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->sites_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
      super__Vector_impl_data._M_finish != pVVar1) {
    (this->sites_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar1;
  }
  std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::reserve
            (local_68,((long)(this->input_vertices_).
                             super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->input_vertices_).
                            super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                            _M_impl.super__Vector_impl_data._M_start) / 0x18);
  uVar5 = 0;
  do {
    uVar5 = (ulong)(int)uVar5;
    if ((ulong)(((long)sorted.
                       super__Vector_base<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)sorted.
                      super__Vector_base<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0xc) <= uVar5) {
      std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::operator=
                (&this->input_vertices_,local_68);
      ppVar2 = (this->input_edges_).
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (ppVar4 = (this->input_edges_).
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppVar4 != ppVar2; ppVar4 = ppVar4 + 1)
      {
        ppVar4->first =
             vmap.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[ppVar4->first];
        ppVar4->second =
             vmap.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[ppVar4->second];
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&vmap.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>::
      ~_Vector_base(&sorted.
                     super__Vector_base<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>
                   );
      return;
    }
    b = (this->input_vertices_).
        super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
        super__Vector_impl_data._M_start +
        sorted.
        super__Vector_base<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar5].second;
    vmap.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [sorted.super__Vector_base<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>
     ._M_impl.super__Vector_impl_data._M_start[uVar5].second] =
         (int)(((long)(this->sites_).
                      super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl
                      .super__Vector_impl_data._M_finish -
               (long)(this->sites_).
                     super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
                     super__Vector_impl_data._M_start) / 0x18);
    lVar6 = uVar5 * 0xc + 0x14;
    while (uVar5 = uVar5 + 1,
          uVar5 < (ulong)(((long)sorted.
                                 super__Vector_base<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)sorted.
                                super__Vector_base<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) / 0xc)) {
      bVar3 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                        ((BasicVector<Vector3,_double,_3UL> *)
                         ((this->input_vertices_).
                          super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                          _M_impl.super__Vector_impl_data._M_start +
                         *(int *)((long)&((sorted.
                                           super__Vector_base<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->first).id_ +
                                 lVar6)),b);
      if (!bVar3) break;
      vmap.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [*(int *)((long)&((sorted.
                         super__Vector_base<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->first).id_ + lVar6)] =
           (int)(((long)(this->sites_).
                        super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->sites_).
                       super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start) / 0x18);
      lVar6 = lVar6 + 0xc;
    }
    std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::push_back(local_68,b);
  } while( true );
}

Assistant:

void S2Builder::CopyInputEdges() {
  // Sort the input vertices, discard duplicates, and update the input edges
  // to refer to the pruned vertex list.  (We sort in the same order used by
  // ChooseInitialSites() to avoid inconsistencies in tests.)
  vector<InputVertexKey> sorted = SortInputVertices();
  vector<InputVertexId> vmap(input_vertices_.size());
  sites_.clear();
  sites_.reserve(input_vertices_.size());
  for (int in = 0; in < sorted.size(); ) {
    const S2Point& site = input_vertices_[sorted[in].second];
    vmap[sorted[in].second] = sites_.size();
    while (++in < sorted.size() && input_vertices_[sorted[in].second] == site) {
      vmap[sorted[in].second] = sites_.size();
    }
    sites_.push_back(site);
  }
  input_vertices_ = sites_;
  for (InputEdge& e : input_edges_) {
    e.first = vmap[e.first];
    e.second = vmap[e.second];
  }
}